

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O3

MessageProcessingResult __thiscall helics::FederateState::processQueue(FederateState *this)

{
  FederateStates FVar1;
  bool bVar2;
  MessageProcessingResult MVar3;
  bool bVar4;
  mapped_type *pmVar5;
  MessageProcessingResult MVar6;
  ActionMessage cmd;
  key_type local_ec;
  ActionMessage local_e8;
  
  MVar6 = HALTED;
  if ((this->state)._M_i != FINISHED) {
    FVar1 = (this->state)._M_i;
    bVar2 = this->mProfilerActive;
    LOCK();
    (this->queueProcessing)._M_base._M_i = true;
    UNLOCK();
    if (bVar2 == true) {
      generateProfilingMessage(this,true);
    }
    MVar3 = processDelayQueue(this);
    if (MVar3 < NEXT_STEP) {
      do {
        gmlc::containers::BlockingQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>
        ::pop(&local_e8,&this->queue);
        bVar4 = messageShouldBeDelayed(this,&local_e8);
        if (bVar4) {
          pmVar5 = std::
                   map<helics::GlobalFederateId,_std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_std::less<helics::GlobalFederateId>,_std::allocator<std::pair<const_helics::GlobalFederateId,_std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>_>_>
                   ::operator[](&this->delayQueues,&local_e8.source_id);
          CLI::std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::push_back
                    ((deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)pmVar5,
                     &local_e8);
        }
        else {
          MVar3 = processActionMessage(this,&local_e8);
          if (MVar3 == DELAY_MESSAGE) {
            local_ec.gid = local_e8.source_id.gid;
            pmVar5 = std::
                     map<helics::GlobalFederateId,_std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_std::less<helics::GlobalFederateId>,_std::allocator<std::pair<const_helics::GlobalFederateId,_std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>_>_>
                     ::operator[](&this->delayQueues,&local_ec);
            CLI::std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::
            push_back((deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)pmVar5
                      ,&local_e8);
            MVar3 = DELAY_MESSAGE;
          }
          else if (MVar3 == ERROR_RESULT) {
            bVar4 = local_e8.messageAction == cmd_global_error;
            ActionMessage::~ActionMessage(&local_e8);
            goto LAB_0030a6df;
          }
        }
        ActionMessage::~ActionMessage(&local_e8);
      } while (MVar3 < NEXT_STEP);
    }
    if (MVar3 == ERROR_RESULT) {
      bVar4 = false;
LAB_0030a6df:
      MVar3 = ERROR_RESULT;
      if ((((FVar1 != ERRORED) && ((this->state)._M_i == ERRORED)) && (!bVar4)) &&
         (this->mParent != (CommonCore *)0x0)) {
        ActionMessage::ActionMessage(&local_e8,cmd_local_error);
        if (this->terminate_on_error == true) {
          ActionMessage::setAction(&local_e8,cmd_global_error);
        }
        else {
          TimeCoordinator::localError
                    ((this->timeCoord)._M_t.
                     super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
                     .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl);
        }
        local_e8.source_id.gid = (this->global_id)._M_i.gid;
        local_e8.dest_id.gid = 0;
        local_e8.messageID = this->errorCode;
        SmallBuffer::operator=(&local_e8.payload,&this->errorString);
        BrokerBase::addActionMessage(&this->mParent->super_BrokerBase,&local_e8);
        ActionMessage::~ActionMessage(&local_e8);
      }
    }
    MVar6 = ERROR_RESULT;
    if (FVar1 != ERRORED) {
      MVar6 = MVar3;
    }
    LOCK();
    (this->queueProcessing)._M_base._M_i = false;
    UNLOCK();
    if (bVar2 != false) {
      generateProfilingMessage(this,false);
    }
  }
  return MVar6;
}

Assistant:

uint64_t FederateState::getQueueSize() const
{
    uint64_t cnt = 0;
    for (const auto& end_point : interfaceInformation.getEndpoints()) {
        cnt += end_point->availableMessages();
    }
    return cnt;
}